

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46c44b::ForcedKeyTestLarge_ForcedFrameIsKey_Test::TestBody
          (ForcedKeyTestLarge_ForcedFrameIsKey_Test *this)

{
  ForcedKeyTestLarge *in_stack_00000160;
  
  ForcedKeyTestLarge::ForcedFrameIsKey(in_stack_00000160);
  return;
}

Assistant:

TEST_P(ForcedKeyTestLarge, ForcedFrameIsKey) { ForcedFrameIsKey(); }